

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_525a::ktxStreamTest_CanWriteKtx1AsKtx2ToCppStream_Test::TestBody
          (ktxStreamTest_CanWriteKtx1AsKtx2ToCppStream_Test *this)

{
  basic_streambuf<char,_std::char_traits<char>_> *pbVar1;
  char *pcVar2;
  size_t sVar3;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_2;
  ostream *poVar4;
  ktx_error_code_e err;
  StreambufStream srcStream;
  KtxTexture<ktxTexture1> srcTexture1;
  KtxTexture<ktxTexture2> dstTexture2;
  StreambufStream dstStream;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  ktx_error_code_e local_a4;
  AssertHelper local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [8];
  _Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false> local_70;
  unique_ptr<ktxStream,_std::default_delete<ktxStream>_> local_60;
  bool local_58;
  KtxTexture<ktxTexture1> local_50;
  KtxTexture<ktxTexture2> local_48;
  AssertHelper local_40;
  StreambufStream local_38;
  
  local_a4 = KTX_INVALID_VALUE;
  pbVar1 = (basic_streambuf<char,_std::char_traits<char>_> *)operator_new(0x68);
  *(code **)pbVar1 = std::ostream::_M_insert<unsigned_long>;
  *(long *)(pbVar1 + 8) = 0;
  *(long *)(pbVar1 + 0x10) = 0;
  *(long *)(pbVar1 + 0x18) = 0;
  *(long *)(pbVar1 + 0x20) = 0;
  *(long *)(pbVar1 + 0x28) = 0;
  *(long *)(pbVar1 + 0x30) = 0;
  std::locale::locale((locale *)(pbVar1 + 0x38));
  *(code **)pbVar1 = std::ios_base::Init::~Init;
  *(undefined4 *)(pbVar1 + 0x40) = 0x18;
  *(basic_streambuf<char,_std::char_traits<char>_> **)(pbVar1 + 0x48) = pbVar1 + 0x58;
  *(long *)(pbVar1 + 0x50) = 0;
  pbVar1[0x58] = (basic_streambuf<char,_std::char_traits<char>_>)0x0;
  local_78 = (undefined1  [8])pbVar1;
  StreambufStream::StreambufStream
            (&local_38,
             (unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
              *)local_78,_S_out|_S_in);
  if (local_78 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_78 + 8))();
  }
  local_50._handle = (ktxTexture1 *)0x0;
  local_48._handle = (ktxTexture2 *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Loading KTX1 from file",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  StreambufStream::StreambufStream
            ((StreambufStream *)local_78,&(this->super_ktxStreamTest)._ktx1Streambuf,_S_in);
  local_a4 = ktxTexture1_CreateFromStream
                       (local_60._M_t.
                        super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                        super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                        super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1,&local_50);
  local_b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_b8._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_98,"err","KTX_SUCCESS",&local_a4,(ktx_error_code_e *)&local_b8);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_b8._M_head_impl + 0x10),
               "Failed to load source KTX1 from C++ stream: ",0x2c);
    pcVar2 = (char *)ktxErrorString(local_a4);
    poVar4 = (ostream *)(local_b8._M_head_impl + 0x10);
    if (pcVar2 == (char *)0x0) {
      sVar3 = 6;
      pcVar2 = "(null)";
    }
    else {
      sVar3 = strlen(pcVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
               ,0x180,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<(anonymous_namespace)::KtxTexture<ktxTexture1>,decltype(nullptr)>
            (local_98,"srcTexture1",&local_50,&local_b8._M_head_impl);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_b8._M_head_impl + 0x10),"Source KTX1 is null",0x13);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
               ,0x181,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    StreambufStream::~StreambufStream((StreambufStream *)local_78);
  }
  else {
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_b8._M_head_impl._0_1_ = local_58;
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_58 == false) {
      testing::Message::Message((Message *)&local_a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_a0.data_)->line,
                 "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)",0x3f);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)&local_b8,
                 (AssertionResult *)"srcStream.destructed()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
                 ,0x182,(char *)local_98);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_98 != (undefined1  [8])&local_88) {
        operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
      }
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
    }
    StreambufStream::~StreambufStream((StreambufStream *)local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Converting KTX1 -> KTX2",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    local_38._seek_mode = _S_out;
    local_a4 = ktxTexture1_WriteKTX2ToStream
                         (local_50._handle,
                          local_38._stream._M_t.
                          super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                          super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl);
    local_98 = (undefined1  [8])((ulong)(uint)local_98._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
              ((internal *)local_78,"err","KTX_SUCCESS",&local_a4,(ktx_error_code_e *)local_98);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_98 + 0x10),"Failed to convert KTX1 -> KTX2 to C++ stream: "
                 ,0x2e);
      pcVar2 = (char *)ktxErrorString(local_a4);
      poVar4 = (ostream *)((long)local_98 + 0x10);
      if (pcVar2 == (char *)0x0) {
        sVar3 = 6;
        pcVar2 = "(null)";
      }
      else {
        sVar3 = strlen(pcVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_head_impl
          == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_70._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
                 ,0x18b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if (local_98 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_98 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_70._M_head_impl);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Loading the converted KTX2",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    (**(code **)(*(long *)local_38._streambuf._M_t.
                          super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>
                          ._M_head_impl + 0x28))
              (local_38._streambuf._M_t.
               super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,0,0,8);
    local_38._seek_mode = _S_in;
    local_a4 = ktxTexture2_CreateFromStream
                         (local_38._stream._M_t.
                          super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                          super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                          super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1,&local_48);
    local_98 = (undefined1  [8])((ulong)local_98 & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
              ((internal *)local_78,"err","KTX_SUCCESS",&local_a4,(ktx_error_code_e *)local_98);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_98 + 0x10),
                 "Failed to load converted KTX2 from C++ stream: ",0x2f);
      pcVar2 = (char *)ktxErrorString(local_a4);
      poVar4 = (ostream *)((long)local_98 + 0x10);
      if (pcVar2 == (char *)0x0) {
        sVar3 = 6;
        pcVar2 = "(null)";
      }
      else {
        sVar3 = strlen(pcVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
      if ((_Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           )local_70._M_head_impl == (basic_streambuf<char,_std::char_traits<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_70._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
                 ,0x195,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if (local_98 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_98 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_70._M_head_impl);
    }
    local_98 = (undefined1  [8])0x0;
    testing::internal::CmpHelperNE<(anonymous_namespace)::KtxTexture<ktxTexture2>,decltype(nullptr)>
              (local_78,"dstTexture2",&local_48,(void **)local_98);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_98);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_98 + 0x10),"Destination KTX2 is null",0x18);
      if ((_Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>)
          local_70._M_head_impl ==
          (_Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_70._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
                 ,0x196,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if (local_98 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_98 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_70._M_head_impl);
    }
  }
  if (local_48._handle != (ktxTexture2 *)0x0) {
    (*(code *)**(undefined8 **)(local_48._handle + 8))();
  }
  if (local_50._handle != (ktxTexture1 *)0x0) {
    (*(code *)**(undefined8 **)(local_50._handle + 8))();
  }
  StreambufStream::~StreambufStream(&local_38);
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanWriteKtx1AsKtx2ToCppStream)
{
    KTX_error_code err{KTX_INVALID_VALUE};
    auto dstStreambuf = std::make_unique<std::stringbuf>();
    StreambufStream dstStream{std::move(dstStreambuf)};

    KtxTexture<ktxTexture1> srcTexture1{nullptr};
    KtxTexture<ktxTexture2> dstTexture2{nullptr};

    {
        std::cerr << "Loading KTX1 from file" << std::endl;

        StreambufStream srcStream{std::move(_ktx1Streambuf), std::ios::in};
        err = ktxTexture1_CreateFromStream(srcStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, srcTexture1.pHandle());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to load source KTX1 from C++ stream: " << ktxErrorString(err);
        ASSERT_NE(srcTexture1, nullptr) << "Source KTX1 is null";
        EXPECT_TRUE(srcStream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
    }
    {
        std::cerr << "Converting KTX1 -> KTX2" << std::endl;

        // We're about to write to `dstStream`
        dstStream.seek_mode(std::ios::out);

        err = ktxTexture1_WriteKTX2ToStream(srcTexture1, dstStream.stream());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to convert KTX1 -> KTX2 to C++ stream: " << ktxErrorString(err);
    }
    {
        std::cerr << "Loading the converted KTX2" << std::endl;

        // Rewind dstStream and set it up for reading
        dstStream.streambuf()->pubseekpos(0, std::ios::in);
        dstStream.seek_mode(std::ios::in);

        err = ktxTexture2_CreateFromStream(dstStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, dstTexture2.pHandle());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to load converted KTX2 from C++ stream: " << ktxErrorString(err);
        ASSERT_NE(dstTexture2, nullptr) << "Destination KTX2 is null";
    }
}